

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

Vector3 * __thiscall
iDynTree::KinDynComputations::getCenterOfMassBiasAcc
          (Vector3 *__return_storage_ptr__,KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  double dVar2;
  undefined1 auVar3 [16];
  Position com_in_inertial;
  Wrench totalMomentumBiasInInertialInertial;
  Wrench totalMomentumBiasInCOMInertial;
  Vector3 comVel;
  Position aPStack_158 [24];
  KinDynComputations local_140;
  Wrench local_128;
  Transform local_f0 [8];
  undefined1 local_e8 [16];
  double local_d8;
  Wrench local_b8;
  Rotation local_58 [72];
  
  computeRawMassMatrixAndTotalMomentum(this);
  computeBiasAccFwdKinematics(this);
  local_128._40_8_ = 0;
  local_128._48_8_ = 0;
  local_128._24_8_ = 0;
  local_128._32_8_ = 0;
  local_128._8_8_ = 0;
  local_128._16_8_ = 0;
  local_128._0_8_ = &PTR__SpatialForceVector_0011ad08;
  pKVar1 = this->pimpl;
  iDynTree::ComputeLinearAndAngularMomentumDerivativeBias
            (&pKVar1->m_robot_model,&pKVar1->m_linkPos,&pKVar1->m_linkVel,&pKVar1->m_linkBiasAcc,
             &local_128);
  getCenterOfMassPosition(&local_140);
  iDynTree::Rotation::Identity();
  iDynTree::Position::operator-(aPStack_158);
  iDynTree::Transform::Transform((Transform *)&local_b8,local_58,aPStack_158);
  iDynTree::Transform::operator*(local_f0,&local_b8);
  getCenterOfMassVelocity((Vector3 *)&local_b8,this);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
  dVar2 = (double)iDynTree::SpatialInertia::getMass();
  auVar3._8_8_ = dVar2;
  auVar3._0_8_ = dVar2;
  auVar3 = divpd(local_e8,auVar3);
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar3;
  __return_storage_ptr__->m_data[2] = local_d8 / dVar2;
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_f0);
  iDynTree::SpatialForceVector::~SpatialForceVector(&local_128.super_SpatialForceVector);
  return __return_storage_ptr__;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassBiasAcc()
{
    this->computeRawMassMatrixAndTotalMomentum();
    this->computeBiasAccFwdKinematics();

    // We compute the bias of the center of mass from the bias of the total momentum derivative
    Wrench totalMomentumBiasInInertialInertial;
    ComputeLinearAndAngularMomentumDerivativeBias(pimpl->m_robot_model,
                                                  pimpl->m_linkPos,
                                                  pimpl->m_linkVel,
                                                  pimpl->m_linkBiasAcc,
                                                  totalMomentumBiasInInertialInertial);

    // The total momentum is written in the (inertial,inertial) frame
    // To get the com velocity, acceleration, we need to write it in the (com,inertial) frame
    // For the velocity we need just to multiply it for the adjoint, for the acceleration
    // we need also to account for the derivative of the adjoint term
    Position com_in_inertial = this->getCenterOfMassPosition();
    Wrench totalMomentumBiasInCOMInertial = Transform(Rotation::Identity(),-com_in_inertial)*totalMomentumBiasInInertialInertial;

    // TODO : cache com velocity
    Vector3 comVel = KinDynComputations::getCenterOfMassVelocity();

    // We account for the derivative of the transform (we can avoid this computation because we are intersted only in the linear part
    // of the momentum derivative
    // toEigen(totalMomentumBiasInCOMInertial.getAngularVec3()) =
    //    toEigen(pimpl->m_totalMomentum.getLinearVec3()).cross(toEigen(comVel));

    double total_mass = pimpl->getRobotLockedInertia().getMass();

    // Mass is constant, so we can easily divide disregarding the derivative
    Vector3 comBiasAcc;

    toEigen(comBiasAcc) = toEigen(totalMomentumBiasInCOMInertial.getLinearVec3())/total_mass;

    return comBiasAcc;
}